

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_NormalizeLanguageTag
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  charcount_t cVar5;
  charcount_t cVar6;
  charcount_t cVar7;
  HRESULT HVar8;
  undefined4 *puVar9;
  Var pvVar10;
  JavascriptString *pJVar11;
  undefined4 extraout_var;
  LPCSTR pCVar12;
  Recycler *this;
  char16_t *destString;
  uint uVar13;
  uint in_stack_00000010;
  CHAR local_1d8 [8];
  char canonicalized [157];
  char localeID [157];
  charcount_t canonicalized16Len;
  undefined1 local_70 [8];
  WideToNarrow langtag8;
  Arguments args;
  charcount_t local_38;
  int local_34;
  int parsedLength;
  UErrorCode status;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar13 = callInfo._0_4_;
  if (in_stack_00000010 != uVar13) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a29eb9;
    *puVar9 = 0;
  }
  langtag8._24_8_ = callInfo;
  if ((uVar13 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38c,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a29eb9;
    *puVar9 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar13 & 0xffffff) == 2) {
    pvVar10 = Arguments::operator[]((Arguments *)&langtag8.freeDst,1);
    bVar3 = VarIs<Js::JavascriptString>(pvVar10);
    if (!bVar3) goto LAB_00a29a86;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x38c,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00a29eb9;
      *puVar9 = 0;
    }
LAB_00a29a86:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38f,
                                "((args.Info.Count == 2 && VarIs<JavascriptString>(args[1])))",
                                "Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00a29eb9;
    *puVar9 = 0;
  }
  local_34 = 0;
  pvVar10 = Arguments::operator[]((Arguments *)&langtag8.freeDst,1);
  pJVar11 = UnsafeVarTo<Js::JavascriptString>(pvVar10);
  iVar4 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar11);
  register0x00000000 = CONCAT44(extraout_var,iVar4);
  cVar5 = JavascriptString::GetLength(pJVar11);
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
  NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>
                       *)local_70,(char16_t **)(canonicalized + 0x98),(ulong)cVar5);
  local_38 = 0;
  memset(canonicalized + 0x98,0,0x9d);
  iVar4 = uloc_forLanguageTag_70(local_70,canonicalized + 0x98,0x9d,&local_38,&local_34);
  if ((int)local_38 < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x39c,"(parsedLength >= 0)","parsedLength >= 0");
    if (!bVar3) goto LAB_00a29eb9;
    *puVar9 = 0;
  }
  cVar5 = local_38;
  if (local_34 != 1) {
    cVar6 = JavascriptString::GetLength(pJVar11);
    cVar7 = local_38;
    if (cVar6 <= cVar5) {
      if (local_34 == 7) {
        Throw::OutOfMemory();
      }
      if (local_34 < 1 && local_34 != -0x7c) {
        if (iVar4 < 0) {
LAB_00a29c70:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x3ad,
                                      "(forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength())"
                                      ,
                                      "forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength()"
                                     );
          goto LAB_00a29cb6;
        }
        cVar6 = JavascriptString::GetLength(pJVar11);
        cVar5 = local_38;
        if (cVar7 != cVar6) {
          cVar7 = JavascriptString::GetLength(pJVar11);
          if (cVar5 != cVar7) goto LAB_00a29c70;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        pCVar12 = (LPCSTR)u_errorName_70(local_34);
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3ad,"(false)",pCVar12);
LAB_00a29cb6:
        if (bVar3 == false) goto LAB_00a29eb9;
        *puVar9 = 0;
      }
      memset(local_1d8,0,0x9d);
      cVar5 = uloc_toLanguageTag_70(canonicalized + 0x98,local_1d8,0x9d,1,&local_34);
      if (local_34 == 7) {
        Throw::OutOfMemory();
      }
      if (local_34 < 1 && local_34 != -0x7c) {
        if ((int)cVar5 < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x3b1,"(toLangTagResultLength > 0)",
                                      "toLangTagResultLength > 0");
          goto LAB_00a29dac;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        pCVar12 = (LPCSTR)u_errorName_70(local_34);
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3b1,"(false)",pCVar12);
LAB_00a29dac:
        if (bVar3 == false) goto LAB_00a29eb9;
        *puVar9 = 0;
      }
      stack0xffffffffffffff68 = &char16_t::typeinfo;
      this = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)(localeID + 0x98));
      destString = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                             ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,
                              (long)(int)(cVar5 + 1));
      stack0xffffffffffffff68 = (undefined **)((ulong)stack0xffffffffffffff68 & 0xffffffff00000000);
      HVar8 = utf8::NarrowStringToWideNoAlloc
                        (local_1d8,(long)(int)cVar5,destString,(long)(int)(cVar5 + 1),
                         (charcount_t *)(localeID + 0x98));
      if ((HVar8 != 0) || (localeID._152_4_ != cVar5)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3bd,
                                    "(hr == ((HRESULT)0x00000000L) && ((int) canonicalized16Len) == toLangTagResultLength)"
                                    ,
                                    "hr == ((HRESULT)0x00000000L) && ((int) canonicalized16Len) == toLangTagResultLength"
                                   );
        if (!bVar3) {
LAB_00a29eb9:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
      }
      pJVar11 = JavascriptString::NewWithBuffer(destString,cVar5,pSVar1);
      goto LAB_00a29e9b;
    }
  }
  pJVar11 = (JavascriptString *)
            (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
LAB_00a29e9b:
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
  ~NarrowWideConverter
            ((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long> *
             )local_70);
  return pJVar11;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_NormalizeLanguageTag(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if defined(INTL_ICU)
        INTL_CHECK_ARGS(args.Info.Count == 2 && VarIs<JavascriptString>(args[1]));

        UErrorCode status = U_ZERO_ERROR;
        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args[1]);
        utf8::WideToNarrow langtag8(langtag->GetSz(), langtag->GetLength());

        // ICU doesn't have a full-fledged canonicalization implementation that correctly replaces all preferred values
        // and grandfathered tags, as required by #sec-canonicalizelanguagetag.
        // However, passing the locale through uloc_forLanguageTag -> uloc_toLanguageTag gets us most of the way there
        // by replacing some(?) values, correctly capitalizing the tag, and re-ordering extensions
        int parsedLength = 0;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        int forLangTagResultLength = uloc_forLanguageTag(langtag8, localeID, ULOC_FULLNAME_CAPACITY, &parsedLength, &status);
        AssertOrFailFast(parsedLength >= 0);
        if (status == U_ILLEGAL_ARGUMENT_ERROR || ((charcount_t) parsedLength) < langtag->GetLength())
        {
            // The string passed in to NormalizeLanguageTag has already passed IsStructurallyValidLanguageTag.
            // However, duplicate unicode extension keys, such as "de-u-co-phonebk-co-phonebk", are structurally
            // valid according to RFC5646 yet still trigger U_ILLEGAL_ARGUMENT_ERROR
            // V8 ~6.2 says that the above language tag is invalid, while SpiderMonkey ~58 handles it.
            // Until we have a more spec-compliant implementation of CanonicalizeLanguageTag, err on the side
            // of caution and say it is invalid.
            // We also check for parsedLength < langtag->GetLength() because there are cases when status == U_ZERO_ERROR
            // but the langtag was not valid, such as "en-tesTER-TESter" (OSS-Fuzz #6657).
            // NOTE: make sure we check for `undefined` at the platform.normalizeLanguageTag callsite.
            return scriptContext->GetLibrary()->GetUndefined();
        }

        // forLangTagResultLength can be 0 if langtag is "und".
        // uloc_toLanguageTag("") returns "und", so this works out (forLanguageTag can return >= 0 but toLanguageTag must return > 0)
        ICU_ASSERT(status, forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength());

        char canonicalized[ULOC_FULLNAME_CAPACITY] = { 0 };
        int toLangTagResultLength = uloc_toLanguageTag(localeID, canonicalized, ULOC_FULLNAME_CAPACITY, true, &status);
        ICU_ASSERT(status, toLangTagResultLength > 0);

        // allocate toLangTagResultLength + 1 to leave room for null terminator
        char16 *canonicalized16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, toLangTagResultLength + 1);
        charcount_t canonicalized16Len = 0;
        HRESULT hr = utf8::NarrowStringToWideNoAlloc(
            canonicalized,
            toLangTagResultLength,
            canonicalized16,
            toLangTagResultLength + 1,
            &canonicalized16Len
        );
        AssertOrFailFast(hr == S_OK && ((int) canonicalized16Len) == toLangTagResultLength);

        return JavascriptString::NewWithBuffer(canonicalized16, toLangTagResultLength, scriptContext);
#else
        if (args.Info.Count < 2 || !VarIs<JavascriptString>(args.Values[1]))
        {
            // NormalizeLanguageTag of undefined or non-string is undefined
            return scriptContext->GetLibrary()->GetUndefined();
        }

        JavascriptString *argString = VarTo<JavascriptString>(args.Values[1]);
        JavascriptString *retVal;
        HRESULT hr;
        AutoHSTRING str;
        hr = GetWindowsGlobalizationAdapter(scriptContext)->NormalizeLanguageTag(scriptContext, argString->GetSz(), &str);
        DelayLoadWindowsGlobalization *wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*str, NULL);
        retVal = Js::JavascriptString::NewCopySz(strBuf, scriptContext);
        if (FAILED(hr))
        {
            HandleOOMSOEHR(hr);
            //If we can't normalize the tag; return undefined.
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return retVal;
#endif
    }